

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TablePrinter * Catch::operator<<(TablePrinter *tp)

{
  size_type sVar1;
  ostream *poVar2;
  pointer pCVar3;
  int __oflag;
  int iVar4;
  value_type *__file;
  long lVar5;
  __string_type *p_Var6;
  value_type colInfo;
  string padding;
  __string_type colStr;
  
  std::__cxx11::stringbuf::str();
  colInfo.name._M_dataplus = colStr._M_dataplus;
  colInfo.name._M_string_length = colStr._M_string_length;
  colInfo.name.field_2._M_allocated_capacity = 0;
  sVar1 = StringRef::numberOfCharacters((StringRef *)&colInfo);
  StringRef::~StringRef((StringRef *)&colInfo);
  p_Var6 = &padding;
  std::__cxx11::string::string((string *)&colInfo,"",(allocator *)p_Var6);
  __file = &colInfo;
  std::__cxx11::stringbuf::str((string *)&tp->field_0x28);
  std::__cxx11::string::~string((string *)&colInfo);
  TablePrinter::open(tp,(char *)__file,__oflag);
  iVar4 = tp->m_currentColumn;
  pCVar3 = (tp->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (iVar4 == (int)(((long)(tp->m_columnInfos).
                            super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0x28) + -1)
  {
    tp->m_currentColumn = -1;
    std::operator<<((ostream *)tp->m_os,"\n");
    iVar4 = tp->m_currentColumn;
    pCVar3 = (tp->m_columnInfos).
             super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  tp->m_currentColumn = iVar4 + 1;
  anon_unknown_1::ColumnInfo::ColumnInfo(&colInfo,pCVar3 + (iVar4 + 1));
  padding._M_dataplus._M_p = (pointer)&padding.field_2;
  lVar5 = (long)colInfo.width - (sVar1 + 2);
  if ((ulong)(long)colInfo.width < sVar1 + 2 || lVar5 == 0) {
    padding._M_string_length = 0;
    padding.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&padding,(char)lVar5);
  }
  if (colInfo.justification == Left) {
    poVar2 = std::operator<<((ostream *)tp->m_os,(string *)&colStr);
  }
  else {
    poVar2 = std::operator<<((ostream *)tp->m_os,(string *)&padding);
    p_Var6 = &colStr;
  }
  poVar2 = std::operator<<(poVar2,(string *)p_Var6);
  std::operator<<(poVar2," ");
  std::__cxx11::string::~string((string *)&padding);
  std::__cxx11::string::~string((string *)&colInfo);
  std::__cxx11::string::~string((string *)&colStr);
  return tp;
}

Assistant:

TablePrinter& operator << (TablePrinter& tp, ColumnBreak) {
        auto colStr = tp.m_oss.str();
        // This takes account of utf8 encodings
        auto strSize = Catch::StringRef(colStr).numberOfCharacters();
        tp.m_oss.str("");
        tp.open();
        if (tp.m_currentColumn == static_cast<int>(tp.m_columnInfos.size() - 1)) {
            tp.m_currentColumn = -1;
            tp.m_os << "\n";
        }
        tp.m_currentColumn++;

        auto colInfo = tp.m_columnInfos[tp.m_currentColumn];
        auto padding = (strSize + 2 < static_cast<std::size_t>(colInfo.width))
            ? std::string(colInfo.width - (strSize + 2), ' ')
            : std::string();
        if (colInfo.justification == ColumnInfo::Left)
            tp.m_os << colStr << padding << " ";
        else
            tp.m_os << padding << colStr << " ";
        return tp;
    }